

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QXmlStreamAttribute>::reserve(QList<QXmlStreamAttribute> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<QXmlStreamAttribute> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QXmlStreamAttribute> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  QXmlStreamAttribute *in_stack_ffffffffffffff60;
  QArrayDataPointer<QXmlStreamAttribute> *in_stack_ffffffffffffff68;
  QXmlStreamAttribute *b;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QXmlStreamAttribute> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  undefined1 local_38 [36];
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<QXmlStreamAttribute> *)0x657a25);
  qVar3 = QArrayDataPointer<QXmlStreamAttribute>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<QXmlStreamAttribute>::operator->(in_RDI);
    local_38._32_4_ =
         QArrayDataPointer<QXmlStreamAttribute>::flags
                   ((QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_00657c01;
    QArrayDataPointer<QXmlStreamAttribute>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QXmlStreamAttribute>::isShared
                      ((QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QXmlStreamAttribute>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QXmlStreamAttribute>::setFlag
                ((QArrayDataPointer<QXmlStreamAttribute> *)0x657adf,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_00657c01;
    }
  }
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QXmlStreamAttribute> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  b = (QXmlStreamAttribute *)local_38;
  QArrayDataPointer<QXmlStreamAttribute>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)b >> 0x20));
  this_00 = (QGenericArrayOps<QXmlStreamAttribute> *)
            QArrayDataPointer<QXmlStreamAttribute>::operator->
                      ((QArrayDataPointer<QXmlStreamAttribute> *)b);
  QArrayDataPointer<QXmlStreamAttribute>::operator->(in_RDI);
  QArrayDataPointer<QXmlStreamAttribute>::begin((QArrayDataPointer<QXmlStreamAttribute> *)0x657b61);
  QArrayDataPointer<QXmlStreamAttribute>::operator->(in_RDI);
  QArrayDataPointer<QXmlStreamAttribute>::end
            ((QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QXmlStreamAttribute>::copyAppend(this_00,b,in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<QXmlStreamAttribute>::d_ptr
                     ((QArrayDataPointer<QXmlStreamAttribute> *)local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (QXmlStreamAttribute *)
         QArrayDataPointer<QXmlStreamAttribute>::operator->
                   ((QArrayDataPointer<QXmlStreamAttribute> *)local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QXmlStreamAttribute>::setFlag
              ((QArrayDataPointer<QXmlStreamAttribute> *)0x657bc8,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QXmlStreamAttribute>::swap
            ((QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff60,
             (QArrayDataPointer<QXmlStreamAttribute> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
            ((QArrayDataPointer<QXmlStreamAttribute> *)in_stack_ffffffffffffff60);
LAB_00657c01:
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}